

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

void secp256k1_ecmult_odd_multiples_table
               (int n,secp256k1_ge *pre_a,secp256k1_fe *zr,secp256k1_fe *z,secp256k1_gej *a)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  ulong uVar5;
  secp256k1_fe *a_00;
  uint uVar6;
  secp256k1_fe *extraout_RDX;
  ulong uVar7;
  ulong extraout_RDX_00;
  secp256k1_ge *a_01;
  secp256k1_ge *a_02;
  secp256k1_ge *a_03;
  secp256k1_ge *psVar8;
  uint64_t uVar9;
  ulong uVar10;
  secp256k1_gej *psVar11;
  secp256k1_gej *a_04;
  undefined4 in_register_0000003c;
  ulong uVar12;
  secp256k1_gej *r;
  secp256k1_gej *a_05;
  ulong uVar13;
  secp256k1_gej *r_00;
  long lVar14;
  secp256k1_fe *psVar15;
  secp256k1_gej *psVar16;
  secp256k1_ge *psVar17;
  secp256k1_fe *psVar18;
  secp256k1_gej *a_06;
  secp256k1_gej ai;
  secp256k1_gej d;
  secp256k1_ge d_ge;
  secp256k1_fe sStack_5f8;
  secp256k1_fe sStack_5c8;
  secp256k1_gej *psStack_598;
  secp256k1_gej *psStack_590;
  secp256k1_gej *psStack_588;
  secp256k1_gej *psStack_580;
  secp256k1_gej *psStack_578;
  ulong uStack_570;
  secp256k1_gej *psStack_568;
  secp256k1_gej *psStack_560;
  secp256k1_gej *psStack_558;
  uint64_t uStack_550;
  uint64_t uStack_548;
  secp256k1_gej *psStack_540;
  secp256k1_gej *psStack_538;
  secp256k1_fe *psStack_530;
  secp256k1_gej *psStack_528;
  undefined1 auStack_520 [56];
  uint64_t uStack_4e8;
  uint64_t uStack_4e0;
  uint64_t uStack_4d8;
  uint64_t uStack_4d0;
  int iStack_4c8;
  undefined1 auStack_4c0 [56];
  uint64_t uStack_488;
  secp256k1_gej *psStack_480;
  secp256k1_gej *psStack_478;
  secp256k1_gej *psStack_470;
  ulong uStack_468;
  undefined1 auStack_460 [56];
  secp256k1_gej *psStack_428;
  uint64_t uStack_420;
  secp256k1_gej *psStack_418;
  ulong uStack_410;
  ulong uStack_408;
  secp256k1_fe sStack_400;
  secp256k1_fe sStack_3d0;
  secp256k1_fe sStack_3a0;
  secp256k1_fe sStack_370;
  undefined1 auStack_340 [96];
  code *pcStack_2e0;
  secp256k1_ge *psStack_2d0;
  secp256k1_gej *psStack_2c8;
  secp256k1_ge *psStack_2b8;
  secp256k1_ge *psStack_2b0;
  undefined1 *puStack_2a8;
  secp256k1_gej sStack_2a0;
  secp256k1_gej local_1c8;
  secp256k1_gej local_130;
  secp256k1_ge local_98;
  
  psVar8 = (secp256k1_ge *)CONCAT44(in_register_0000003c,n);
  if ((int)z[3].n[0] == 0) {
    secp256k1_gej_double_var(&local_130,(secp256k1_gej *)z,(secp256k1_fe *)0x0);
    secp256k1_ge_set_xy(&local_98,&local_130.x,&local_130.y);
    secp256k1_ge_set_gej_zinv(psVar8,(secp256k1_gej *)z,&local_130.z);
    secp256k1_gej_set_ge(&local_1c8,psVar8);
    local_1c8.z.n[0] = z[2].n[0];
    local_1c8.z.n[1] = z[2].n[1];
    local_1c8.z.n[2] = z[2].n[2];
    local_1c8.z.n[3] = z[2].n[3];
    local_1c8.z.n[4] = z[2].n[4];
    local_1c8.z.magnitude = z[2].magnitude;
    local_1c8.z.normalized = z[2].normalized;
    (pre_a->x).n[4] = local_130.z.n[4];
    (pre_a->x).magnitude = local_130.z.magnitude;
    (pre_a->x).normalized = local_130.z.normalized;
    (pre_a->x).n[2] = local_130.z.n[2];
    (pre_a->x).n[3] = local_130.z.n[3];
    (pre_a->x).n[0] = local_130.z.n[0];
    (pre_a->x).n[1] = local_130.z.n[1];
    lVar14 = 0x30;
    do {
      psVar8 = psVar8 + 1;
      secp256k1_gej_add_ge_var
                (&local_1c8,&local_1c8,&local_98,(secp256k1_fe *)((long)(pre_a->x).n + lVar14));
      secp256k1_ge_set_xy(psVar8,&local_1c8.x,&local_1c8.y);
      lVar14 = lVar14 + 0x30;
    } while (lVar14 != 0xc0);
    secp256k1_fe_mul(zr,&local_1c8.z,&local_130.z);
    return;
  }
  secp256k1_ecmult_odd_multiples_table_cold_1();
  psVar15 = extraout_RDX;
  psStack_2b8 = pre_a;
  psStack_2b0 = psVar8;
  if (psVar8 != (secp256k1_ge *)0x0) {
    do {
      psStack_2c8 = (secp256k1_gej *)0x11a24f;
      secp256k1_ge_verify(pre_a);
      psStack_2c8 = (secp256k1_gej *)0x11a257;
      secp256k1_fe_verify(psVar15);
      psVar17 = psStack_2b0;
      a_03 = psStack_2b8;
      psVar15 = psVar15 + 1;
      pre_a = pre_a + 1;
      psVar8 = (secp256k1_ge *)&psVar8[-1].field_0x67;
    } while (psVar8 != (secp256k1_ge *)0x0);
    psVar15 = (secp256k1_fe *)&psStack_2b0[-1].field_0x67;
    psVar18 = &psStack_2b8[(long)psVar15].y;
    psStack_2c8 = (secp256k1_gej *)0x11a286;
    secp256k1_fe_verify(psVar18);
    uVar5 = a_03[(long)psVar15].y.n[4];
    a_00 = (secp256k1_fe *)(uVar5 & 0xffffffffffff);
    uVar7 = (uVar5 >> 0x30) * 0x1000003d1 + psVar18->n[0];
    uVar5 = (uVar7 >> 0x34) + a_03[(long)psVar15].y.n[1];
    uVar10 = (uVar5 >> 0x34) + a_03[(long)psVar15].y.n[2];
    uVar12 = (uVar10 >> 0x34) + a_03[(long)psVar15].y.n[3];
    psVar11 = (secp256k1_gej *)(uVar10 & 0xfffffffffffff);
    psVar18->n[0] = uVar7 & 0xfffffffffffff;
    a_03[(long)psVar15].y.n[1] = uVar5 & 0xfffffffffffff;
    a_03[(long)psVar15].y.n[2] = (uint64_t)psVar11;
    a_03[(long)psVar15].y.n[3] = uVar12 & 0xfffffffffffff;
    a_03[(long)psVar15].y.n[4] = (long)a_00->n + (uVar12 >> 0x34);
    a_03[(long)psVar15].y.magnitude = 1;
    psStack_2c8 = (secp256k1_gej *)0x11a31b;
    secp256k1_fe_verify(psVar18);
    sStack_2a0.x.n[0] = extraout_RDX[(long)psVar15].n[0];
    sStack_2a0.x.n[1] = extraout_RDX[(long)psVar15].n[1];
    sStack_2a0.x.n[2] = extraout_RDX[(long)psVar15].n[2];
    sStack_2a0.x.n[3] = (extraout_RDX[(long)psVar15].n + 2)[1];
    sStack_2a0.x.n[4] = extraout_RDX[(long)psVar15].n[4];
    sStack_2a0.x._40_8_ = (extraout_RDX[(long)psVar15].n + 4)[1];
    puStack_2a8 = (undefined1 *)psVar15;
    if (psVar15 != (secp256k1_fe *)0x0) {
      psVar8 = a_03 + (long)&psVar17[-1].field_0x66;
      psVar18 = extraout_RDX + (long)psVar17;
      uVar9 = 0;
      do {
        psVar18 = psVar18 + -1;
        if (uVar9 != 0) {
          psStack_2c8 = (secp256k1_gej *)0x11a390;
          psVar11 = &sStack_2a0;
          secp256k1_fe_mul(&sStack_2a0.x,&sStack_2a0.x,psVar18);
        }
        psStack_2c8 = (secp256k1_gej *)0x11a398;
        secp256k1_ge_verify(psVar8);
        psStack_2c8 = (secp256k1_gej *)0x11a3a0;
        r = &sStack_2a0;
        secp256k1_fe_verify(&sStack_2a0.x);
        if (psVar8->infinity != 0) {
          psStack_2c8 = (secp256k1_gej *)secp256k1_ecmult_table_get_ge_storage;
          secp256k1_ge_table_set_globalz_cold_1();
          psStack_2d0 = a_03;
          psStack_2c8 = &sStack_2a0;
          if ((extraout_RDX_00 & 1) == 0) {
            pcStack_2e0 = (code *)0x11a50b;
            secp256k1_ecmult_table_get_ge_storage_cold_3();
LAB_0011a50b:
            pcStack_2e0 = (code *)0x11a510;
            secp256k1_ecmult_table_get_ge_storage_cold_2();
          }
          else {
            uVar6 = (uint)extraout_RDX_00;
            if ((int)uVar6 < -7) goto LAB_0011a50b;
            if ((int)uVar6 < 8) {
              if (0 < (int)uVar6) {
                secp256k1_ge_from_storage
                          ((secp256k1_ge *)r,
                           (secp256k1_ge_storage *)
                           ((long)&psVar11->x + (ulong)(uVar6 - 1 >> 1) * 0x40));
                return;
              }
              pcStack_2e0 = (code *)0x11a498;
              secp256k1_ge_from_storage
                        ((secp256k1_ge *)r,
                         (secp256k1_ge_storage *)((long)&psVar11->x + (ulong)(~uVar6 >> 1) * 0x40));
              pcStack_2e0 = (code *)0x11a4a4;
              secp256k1_fe_verify(&r->y);
              pcStack_2e0 = (code *)0x11a4b1;
              secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)(r->y).magnitude,1);
              uVar9 = (r->y).n[1];
              uVar2 = (r->y).n[2];
              uVar3 = (r->y).n[3];
              (r->y).n[0] = 0x3ffffbfffff0bc - (r->y).n[0];
              (r->y).n[1] = 0x3ffffffffffffc - uVar9;
              (r->y).n[2] = 0x3ffffffffffffc - uVar2;
              (r->y).n[3] = 0x3ffffffffffffc - uVar3;
              (r->y).n[4] = 0x3fffffffffffc - (r->y).n[4];
              (r->y).magnitude = 2;
              (r->y).normalized = 0;
              secp256k1_fe_verify(&r->y);
              return;
            }
          }
          pcStack_2e0 = secp256k1_gej_add_zinv_var;
          secp256k1_ecmult_table_get_ge_storage_cold_1();
          psStack_578 = (secp256k1_gej *)0x11a53a;
          auStack_340._56_8_ = a_03;
          auStack_340._64_8_ = psVar8;
          auStack_340._72_8_ = psVar15;
          auStack_340._80_8_ = &sStack_2a0;
          auStack_340._88_8_ = psVar18;
          pcStack_2e0 = (code *)uVar9;
          secp256k1_gej_verify(psVar11);
          psStack_578 = (secp256k1_gej *)0x11a542;
          secp256k1_ge_verify(a_01);
          psStack_578 = (secp256k1_gej *)0x11a54a;
          secp256k1_fe_verify(a_00);
          if (psVar11->infinity != 0) {
            r->infinity = a_01->infinity;
            psStack_578 = (secp256k1_gej *)0x11a576;
            secp256k1_fe_sqr(&sStack_400,a_00);
            psStack_578 = (secp256k1_gej *)0x11a58c;
            secp256k1_fe_mul(&sStack_370,&sStack_400,a_00);
            psStack_578 = (secp256k1_gej *)0x11a59a;
            secp256k1_fe_mul(&r->x,&a_01->x,&sStack_400);
            psStack_578 = (secp256k1_gej *)0x11a5ad;
            secp256k1_fe_mul(&r->y,&a_01->y,&sStack_370);
            psVar11 = (secp256k1_gej *)&r->z;
            (r->z).n[0] = 1;
            (r->z).n[1] = 0;
            (r->z).n[2] = 0;
            (r->z).n[3] = 0;
            (r->z).n[4] = 0;
            (r->z).magnitude = 1;
            (r->z).normalized = 1;
LAB_0011a5d8:
            psStack_578 = (secp256k1_gej *)0x11a5dd;
            secp256k1_fe_verify(&psVar11->x);
            psStack_578 = (secp256k1_gej *)0x11a5e5;
            secp256k1_gej_verify(r);
            return;
          }
          if (a_01->infinity != 0) {
            memcpy(r,psVar11,0x98);
            return;
          }
          psStack_530 = &psVar11->z;
          psStack_578 = (secp256k1_gej *)0x11a63c;
          secp256k1_fe_mul(&sStack_400,psStack_530,a_00);
          psStack_578 = (secp256k1_gej *)0x11a64f;
          secp256k1_fe_sqr(&sStack_370,&sStack_400);
          sStack_3d0.n[0] = (psVar11->x).n[0];
          sStack_3d0.n[1] = (psVar11->x).n[1];
          sStack_3d0.n[2] = (psVar11->x).n[2];
          sStack_3d0.n[3] = (psVar11->x).n[3];
          sStack_3d0.n[4] = (psVar11->x).n[4];
          sStack_3d0.magnitude = (psVar11->x).magnitude;
          sStack_3d0.normalized = (psVar11->x).normalized;
          psStack_578 = (secp256k1_gej *)0x11a684;
          secp256k1_fe_mul((secp256k1_fe *)auStack_4c0,&a_01->x,&sStack_370);
          auStack_520._0_8_ = (psVar11->y).n[0];
          auStack_520._8_8_ = (psVar11->y).n[1];
          auStack_520._16_8_ = (psVar11->y).n[2];
          auStack_520._24_8_ = (psVar11->y).n[3];
          auStack_520._32_8_ = (psVar11->y).n[4];
          auStack_520._40_4_ = (psVar11->y).magnitude;
          auStack_520._44_4_ = (psVar11->y).normalized;
          psStack_578 = (secp256k1_gej *)0x11a6c5;
          psStack_568 = psVar11;
          secp256k1_fe_mul(&sStack_3a0,&a_01->y,&sStack_370);
          psStack_578 = (secp256k1_gej *)0x11a6d8;
          secp256k1_fe_mul(&sStack_3a0,&sStack_3a0,&sStack_400);
          psStack_578 = (secp256k1_gej *)0x11a6e0;
          secp256k1_fe_verify(&sStack_3d0);
          a_04 = (secp256k1_gej *)0x4;
          psStack_578 = (secp256k1_gej *)0x11a6ed;
          secp256k1_fe_verify_magnitude((secp256k1_fe *)(sStack_3d0._40_8_ & 0xffffffff),4);
          psVar11 = (secp256k1_gej *)(0x9ffff5ffffd9d6 - sStack_3d0.n[0]);
          psVar16 = (secp256k1_gej *)(0x9ffffffffffff6 - sStack_3d0.n[1]);
          uVar9 = 0x9ffffffffffff6 - sStack_3d0.n[2];
          r_00 = (secp256k1_gej *)(0x9ffffffffffff6 - sStack_3d0.n[3]);
          uStack_570 = 0x9fffffffffff6 - sStack_3d0.n[4];
          uStack_408 = 5;
          psStack_578 = (secp256k1_gej *)0x11a75a;
          auStack_460._48_8_ = psVar11;
          psStack_428 = psVar16;
          uStack_420 = uVar9;
          psStack_418 = r_00;
          uStack_410 = uStack_570;
          secp256k1_fe_verify((secp256k1_fe *)(auStack_460 + 0x30));
          psStack_578 = (secp256k1_gej *)0x11a762;
          secp256k1_fe_verify((secp256k1_fe *)(auStack_460 + 0x30));
          a_06 = (secp256k1_gej *)auStack_4c0;
          psStack_578 = (secp256k1_gej *)0x11a772;
          a_05 = a_06;
          secp256k1_fe_verify((secp256k1_fe *)a_06);
          if ((int)auStack_4c0._40_4_ < 0x1c) {
            psStack_528 = (secp256k1_gej *)((long)(psVar11->x).n + auStack_4c0._0_8_);
            psStack_538 = (secp256k1_gej *)((long)(psVar16->x).n + auStack_4c0._8_8_);
            uStack_548 = uVar9 + auStack_4c0._16_8_;
            psStack_540 = (secp256k1_gej *)((long)(r_00->x).n + auStack_4c0._24_8_);
            uStack_570 = uStack_570 + auStack_4c0._32_8_;
            uStack_408 = (ulong)(auStack_4c0._40_4_ + 5);
            psStack_578 = (secp256k1_gej *)0x11a7f0;
            auStack_460._48_8_ = psStack_528;
            psStack_428 = psStack_538;
            uStack_420 = uStack_548;
            psStack_418 = psStack_540;
            uStack_410 = uStack_570;
            secp256k1_fe_verify((secp256k1_fe *)(auStack_460 + 0x30));
            psStack_578 = (secp256k1_gej *)0x11a800;
            secp256k1_fe_verify(&sStack_3a0);
            a_04 = (secp256k1_gej *)0x1;
            psStack_578 = (secp256k1_gej *)0x11a80e;
            secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)sStack_3a0.magnitude,1);
            r_00 = (secp256k1_gej *)(0x3ffffbfffff0bc - sStack_3a0.n[0]);
            psVar16 = (secp256k1_gej *)(0x3ffffffffffffc - sStack_3a0.n[2]);
            a_06 = (secp256k1_gej *)(0x3ffffffffffffc - sStack_3a0.n[3]);
            psVar11 = (secp256k1_gej *)(0x3fffffffffffc - sStack_3a0.n[4]);
            uStack_468 = 2;
            psStack_578 = (secp256k1_gej *)0x11a870;
            auStack_4c0._48_8_ = r_00;
            uStack_488 = 0x3ffffffffffffc - sStack_3a0.n[1];
            psStack_480 = psVar16;
            psStack_478 = a_06;
            psStack_470 = psVar11;
            secp256k1_fe_verify((secp256k1_fe *)(auStack_4c0 + 0x30));
            psStack_578 = (secp256k1_gej *)0x11a87d;
            secp256k1_fe_verify((secp256k1_fe *)(auStack_4c0 + 0x30));
            a_05 = (secp256k1_gej *)auStack_520;
            psStack_578 = (secp256k1_gej *)0x11a887;
            secp256k1_fe_verify((secp256k1_fe *)a_05);
            if (0x1e < (int)auStack_520._40_4_) goto LAB_0011ad86;
            psStack_558 = (secp256k1_gej *)((long)(r_00->x).n + auStack_520._0_8_);
            uStack_550 = (0x3ffffffffffffc - sStack_3a0.n[1]) + auStack_520._8_8_;
            psStack_560 = (secp256k1_gej *)((long)(psVar16->x).n + auStack_520._16_8_);
            psVar16 = (secp256k1_gej *)((long)(a_06->x).n + auStack_520._24_8_);
            psVar11 = (secp256k1_gej *)((long)(psVar11->x).n + auStack_520._32_8_);
            uStack_468 = (ulong)(auStack_520._40_4_ + 2);
            psStack_578 = (secp256k1_gej *)0x11a8f0;
            auStack_4c0._48_8_ = psStack_558;
            uStack_488 = uStack_550;
            psStack_480 = psStack_560;
            psStack_478 = psVar16;
            psStack_470 = psVar11;
            secp256k1_fe_verify((secp256k1_fe *)(auStack_4c0 + 0x30));
            psStack_578 = (secp256k1_gej *)0x11a8fd;
            secp256k1_fe_verify((secp256k1_fe *)(auStack_460 + 0x30));
            uVar5 = (uStack_570 >> 0x30) * 0x1000003d1 + (long)psStack_528;
            if (((uVar5 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar5 & 0xfffffffffffff) == 0))
            {
              uVar13 = (long)(psStack_538->x).n + (uVar5 >> 0x34);
              uVar7 = (uVar13 >> 0x34) + uStack_548;
              uVar10 = (long)(psStack_540->x).n + (uVar7 >> 0x34);
              uVar12 = (uVar10 >> 0x34) + (uStack_570 & 0xffffffffffff);
              if ((((uVar13 | uVar5 | uVar7 | uVar10) & 0xfffffffffffff) == 0 && uVar12 == 0) ||
                 (((uVar5 | 0x1000003d0) & uVar13 & uVar7 & uVar10 & (uVar12 ^ 0xf000000000000)) ==
                  0xfffffffffffff)) {
                psStack_578 = (secp256k1_gej *)0x11acc2;
                secp256k1_fe_verify((secp256k1_fe *)(auStack_4c0 + 0x30));
                uVar5 = ((ulong)psVar11 >> 0x30) * 0x1000003d1 + (long)psStack_558;
                if (((uVar5 & 0xfffffffffffff) == 0xffffefffffc2f) ||
                   ((uVar5 & 0xfffffffffffff) == 0)) {
                  uVar13 = uStack_550 + (uVar5 >> 0x34);
                  uVar7 = (long)(psStack_560->x).n + (uVar13 >> 0x34);
                  uVar10 = (long)(psVar16->x).n + (uVar7 >> 0x34);
                  uVar12 = (uVar10 >> 0x34) + ((ulong)psVar11 & 0xffffffffffff);
                  if ((((uVar13 | uVar5 | uVar7 | uVar10) & 0xfffffffffffff) == 0 && uVar12 == 0) ||
                     (((uVar5 | 0x1000003d0) & uVar13 & uVar7 & uVar10 & (uVar12 ^ 0xf000000000000))
                      == 0xfffffffffffff)) {
                    psStack_578 = (secp256k1_gej *)0x11ad7c;
                    secp256k1_gej_double_var(r,psStack_568,(secp256k1_fe *)0x0);
                    return;
                  }
                }
                psStack_578 = (secp256k1_gej *)0x11ad68;
                secp256k1_gej_set_infinity(r);
                return;
              }
            }
            r->infinity = 0;
            a_06 = (secp256k1_gej *)(auStack_460 + 0x30);
            psStack_578 = (secp256k1_gej *)0x11a9e4;
            secp256k1_fe_mul(&r->z,psStack_530,(secp256k1_fe *)a_06);
            psVar11 = (secp256k1_gej *)auStack_340;
            psStack_578 = (secp256k1_gej *)0x11a9f7;
            secp256k1_fe_sqr((secp256k1_fe *)psVar11,(secp256k1_fe *)a_06);
            psStack_578 = (secp256k1_gej *)0x11a9ff;
            secp256k1_fe_verify((secp256k1_fe *)psVar11);
            psStack_578 = (secp256k1_gej *)0x11aa0d;
            secp256k1_fe_verify_magnitude((secp256k1_fe *)(auStack_340._40_8_ & 0xffffffff),1);
            auStack_340._0_8_ = 0x3ffffbfffff0bc - auStack_340._0_8_;
            auStack_340._8_8_ = 0x3ffffffffffffc - auStack_340._8_8_;
            auStack_340._16_8_ = 0x3ffffffffffffc - auStack_340._16_8_;
            auStack_340._24_8_ = 0x3ffffffffffffc - auStack_340._24_8_;
            auStack_340._32_8_ = 0x3fffffffffffc - auStack_340._32_8_;
            auStack_340._40_8_ = 2;
            psStack_578 = (secp256k1_gej *)0x11aa55;
            secp256k1_fe_verify((secp256k1_fe *)psVar11);
            r_00 = (secp256k1_gej *)(auStack_520 + 0x30);
            psStack_578 = (secp256k1_gej *)0x11aa6b;
            secp256k1_fe_mul((secp256k1_fe *)r_00,(secp256k1_fe *)psVar11,(secp256k1_fe *)a_06);
            psStack_578 = (secp256k1_gej *)0x11aa83;
            secp256k1_fe_mul((secp256k1_fe *)auStack_460,&sStack_3d0,(secp256k1_fe *)psVar11);
            a_04 = (secp256k1_gej *)(auStack_4c0 + 0x30);
            psStack_578 = (secp256k1_gej *)0x11aa93;
            secp256k1_fe_sqr(&r->x,(secp256k1_fe *)a_04);
            psStack_578 = (secp256k1_gej *)0x11aa9b;
            secp256k1_fe_verify(&r->x);
            psStack_578 = (secp256k1_gej *)0x11aaa3;
            a_05 = r_00;
            secp256k1_fe_verify((secp256k1_fe *)r_00);
            iVar4 = iStack_4c8 + (r->x).magnitude;
            if (0x20 < iVar4) goto LAB_0011ad8b;
            uVar9 = (r->x).n[1];
            uVar2 = (r->x).n[2];
            uVar3 = (r->x).n[3];
            (r->x).n[0] = (r->x).n[0] + auStack_520._48_8_;
            (r->x).n[1] = uVar9 + uStack_4e8;
            (r->x).n[2] = uVar2 + uStack_4e0;
            (r->x).n[3] = uVar3 + uStack_4d8;
            puVar1 = (r->x).n + 4;
            *puVar1 = *puVar1 + uStack_4d0;
            (r->x).magnitude = iVar4;
            (r->x).normalized = 0;
            psStack_578 = (secp256k1_gej *)0x11aaf6;
            secp256k1_fe_verify(&r->x);
            psStack_578 = (secp256k1_gej *)0x11aafe;
            secp256k1_fe_verify(&r->x);
            psVar11 = (secp256k1_gej *)auStack_460;
            psStack_578 = (secp256k1_gej *)0x11ab0e;
            a_05 = psVar11;
            secp256k1_fe_verify((secp256k1_fe *)psVar11);
            iVar4 = auStack_460._40_4_ + (r->x).magnitude;
            if (0x20 < iVar4) goto LAB_0011ad90;
            uVar9 = (r->x).n[1];
            uVar2 = (r->x).n[2];
            uVar3 = (r->x).n[3];
            psVar11 = (secp256k1_gej *)auStack_460;
            (r->x).n[0] = (r->x).n[0] + auStack_460._0_8_;
            (r->x).n[1] = uVar9 + auStack_460._8_8_;
            (r->x).n[2] = uVar2 + auStack_460._16_8_;
            (r->x).n[3] = uVar3 + auStack_460._24_8_;
            puVar1 = (r->x).n + 4;
            *puVar1 = *puVar1 + auStack_460._32_8_;
            (r->x).magnitude = iVar4;
            (r->x).normalized = 0;
            psStack_578 = (secp256k1_gej *)0x11ab5d;
            secp256k1_fe_verify(&r->x);
            psStack_578 = (secp256k1_gej *)0x11ab65;
            secp256k1_fe_verify(&r->x);
            psStack_578 = (secp256k1_gej *)0x11ab6d;
            a_05 = psVar11;
            secp256k1_fe_verify((secp256k1_fe *)psVar11);
            iVar4 = auStack_460._40_4_ + (r->x).magnitude;
            if (0x20 < iVar4) goto LAB_0011ad95;
            uVar9 = (r->x).n[1];
            uVar2 = (r->x).n[2];
            uVar3 = (r->x).n[3];
            psVar11 = (secp256k1_gej *)auStack_460;
            (r->x).n[0] = (r->x).n[0] + auStack_460._0_8_;
            (r->x).n[1] = uVar9 + auStack_460._8_8_;
            (r->x).n[2] = uVar2 + auStack_460._16_8_;
            (r->x).n[3] = uVar3 + auStack_460._24_8_;
            puVar1 = (r->x).n + 4;
            *puVar1 = *puVar1 + auStack_460._32_8_;
            (r->x).magnitude = iVar4;
            (r->x).normalized = 0;
            psStack_578 = (secp256k1_gej *)0x11abbc;
            secp256k1_fe_verify(&r->x);
            psStack_578 = (secp256k1_gej *)0x11abc4;
            secp256k1_fe_verify((secp256k1_fe *)psVar11);
            psStack_578 = (secp256k1_gej *)0x11abcc;
            a_05 = r;
            secp256k1_fe_verify(&r->x);
            iVar4 = (r->x).magnitude + auStack_460._40_4_;
            if (iVar4 < 0x21) {
              auStack_460._0_8_ = (r->x).n[0] + auStack_460._0_8_;
              auStack_460._8_8_ = (r->x).n[1] + auStack_460._8_8_;
              auStack_460._16_8_ = (r->x).n[2] + auStack_460._16_8_;
              auStack_460._24_8_ = (r->x).n[3] + auStack_460._24_8_;
              auStack_460._32_8_ = auStack_460._32_8_ + (r->x).n[4];
              auStack_460._44_4_ = 0;
              psStack_578 = (secp256k1_gej *)0x11ac1f;
              auStack_460._40_4_ = iVar4;
              secp256k1_fe_verify((secp256k1_fe *)auStack_460);
              psVar11 = (secp256k1_gej *)&r->y;
              psStack_578 = (secp256k1_gej *)0x11ac36;
              secp256k1_fe_mul((secp256k1_fe *)psVar11,(secp256k1_fe *)auStack_460,
                               (secp256k1_fe *)(auStack_4c0 + 0x30));
              a_06 = (secp256k1_gej *)(auStack_520 + 0x30);
              psStack_578 = (secp256k1_gej *)0x11ac4e;
              a_04 = a_06;
              secp256k1_fe_mul((secp256k1_fe *)a_06,(secp256k1_fe *)a_06,(secp256k1_fe *)auStack_520
                              );
              psStack_578 = (secp256k1_gej *)0x11ac56;
              secp256k1_fe_verify((secp256k1_fe *)psVar11);
              psStack_578 = (secp256k1_gej *)0x11ac5e;
              a_05 = a_06;
              secp256k1_fe_verify((secp256k1_fe *)a_06);
              iStack_4c8 = iStack_4c8 + (r->y).magnitude;
              if (iStack_4c8 < 0x21) {
                uVar9 = (r->y).n[1];
                uVar2 = (r->y).n[2];
                uVar3 = (r->y).n[3];
                (r->y).n[0] = (r->y).n[0] + auStack_520._48_8_;
                (r->y).n[1] = uVar9 + uStack_4e8;
                (r->y).n[2] = uVar2 + uStack_4e0;
                (r->y).n[3] = uVar3 + uStack_4d8;
                puVar1 = (r->y).n + 4;
                *puVar1 = *puVar1 + uStack_4d0;
                (r->y).magnitude = iStack_4c8;
                (r->y).normalized = 0;
                goto LAB_0011a5d8;
              }
              goto LAB_0011ad9f;
            }
          }
          else {
            psStack_578 = (secp256k1_gej *)0x11ad86;
            secp256k1_gej_add_zinv_var_cold_7();
LAB_0011ad86:
            psStack_578 = (secp256k1_gej *)0x11ad8b;
            secp256k1_gej_add_zinv_var_cold_6();
LAB_0011ad8b:
            psStack_578 = (secp256k1_gej *)0x11ad90;
            secp256k1_gej_add_zinv_var_cold_5();
LAB_0011ad90:
            psStack_578 = (secp256k1_gej *)0x11ad95;
            secp256k1_gej_add_zinv_var_cold_4();
LAB_0011ad95:
            psStack_578 = (secp256k1_gej *)0x11ad9a;
            secp256k1_gej_add_zinv_var_cold_3();
          }
          psStack_578 = (secp256k1_gej *)0x11ad9f;
          secp256k1_gej_add_zinv_var_cold_2();
LAB_0011ad9f:
          psStack_578 = (secp256k1_gej *)secp256k1_ge_set_gej_zinv;
          secp256k1_gej_add_zinv_var_cold_1();
          psStack_598 = r;
          psStack_590 = r_00;
          psStack_588 = psVar16;
          psStack_580 = psVar11;
          psStack_578 = a_06;
          secp256k1_gej_verify(a_04);
          psVar8 = a_02;
          secp256k1_fe_verify(&a_02->x);
          if (a_04->infinity == 0) {
            secp256k1_fe_sqr(&sStack_5c8,&a_02->x);
            secp256k1_fe_mul(&sStack_5f8,&sStack_5c8,&a_02->x);
            secp256k1_fe_mul(&a_05->x,&a_04->x,&sStack_5c8);
            secp256k1_fe_mul(&a_05->y,&a_04->y,&sStack_5f8);
            *(int *)(a_05->z).n = a_04->infinity;
            secp256k1_ge_verify((secp256k1_ge *)a_05);
            return;
          }
          secp256k1_ge_set_gej_zinv_cold_1();
          psVar8->infinity = 1;
          (psVar8->x).n[0] = 0;
          (psVar8->x).n[1] = 0;
          (psVar8->x).n[2] = 0;
          (psVar8->x).n[3] = 0;
          *(undefined8 *)((long)(psVar8->x).n + 0x1c) = 0;
          *(undefined8 *)((long)(psVar8->x).n + 0x24) = 0;
          (psVar8->x).normalized = 1;
          secp256k1_fe_verify(&psVar8->x);
          *(undefined8 *)((long)(psVar8->y).n + 0x1c) = 0;
          *(undefined8 *)((long)(psVar8->y).n + 0x24) = 0;
          (psVar8->y).n[2] = 0;
          (psVar8->y).n[3] = 0;
          (psVar8->y).n[0] = 0;
          (psVar8->y).n[1] = 0;
          (psVar8->y).normalized = 1;
          secp256k1_fe_verify(&psVar8->y);
          secp256k1_ge_verify(psVar8);
          return;
        }
        psVar15 = (secp256k1_fe *)(sStack_2a0.z.n + 1);
        psStack_2c8 = (secp256k1_gej *)0x11a3bf;
        secp256k1_fe_sqr(psVar15,&sStack_2a0.x);
        a_03 = (secp256k1_ge *)(sStack_2a0.y.n + 1);
        psStack_2c8 = (secp256k1_gej *)0x11a3d2;
        secp256k1_fe_mul((secp256k1_fe *)a_03,psVar15,&sStack_2a0.x);
        psStack_2c8 = (secp256k1_gej *)0x11a3e0;
        secp256k1_fe_mul(&psVar8->x,&psVar8->x,psVar15);
        psVar11 = (secp256k1_gej *)&psVar8->y;
        psStack_2c8 = (secp256k1_gej *)0x11a3f0;
        secp256k1_fe_mul((secp256k1_fe *)psVar11,(secp256k1_fe *)psVar11,(secp256k1_fe *)a_03);
        psStack_2c8 = (secp256k1_gej *)0x11a3f8;
        secp256k1_ge_verify(psVar8);
        uVar9 = uVar9 + 1;
        psVar8 = psVar8 + -1;
      } while (puStack_2a8 != (undefined1 *)uVar9);
      a_03 = psStack_2b8;
      psVar17 = psStack_2b0;
      if (psStack_2b0 == (secp256k1_ge *)0x0) {
        return;
      }
    }
    do {
      psStack_2c8 = (secp256k1_gej *)0x11a425;
      secp256k1_ge_verify(a_03);
      a_03 = a_03 + 1;
      psVar17 = (secp256k1_ge *)&psVar17[-1].field_0x67;
    } while (psVar17 != (secp256k1_ge *)0x0);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_odd_multiples_table(int n, secp256k1_ge *pre_a, secp256k1_fe *zr, secp256k1_fe *z, const secp256k1_gej *a) {
    secp256k1_gej d, ai;
    secp256k1_ge d_ge;
    int i;

    VERIFY_CHECK(!a->infinity);

    secp256k1_gej_double_var(&d, a, NULL);

    /*
     * Perform the additions using an isomorphic curve Y^2 = X^3 + 7*C^6 where C := d.z.
     * The isomorphism, phi, maps a secp256k1 point (x, y) to the point (x*C^2, y*C^3) on the other curve.
     * In Jacobian coordinates phi maps (x, y, z) to (x*C^2, y*C^3, z) or, equivalently to (x, y, z/C).
     *
     *     phi(x, y, z) = (x*C^2, y*C^3, z) = (x, y, z/C)
     *   d_ge := phi(d) = (d.x, d.y, 1)
     *     ai := phi(a) = (a.x*C^2, a.y*C^3, a.z)
     *
     * The group addition functions work correctly on these isomorphic curves.
     * In particular phi(d) is easy to represent in affine coordinates under this isomorphism.
     * This lets us use the faster secp256k1_gej_add_ge_var group addition function that we wouldn't be able to use otherwise.
     */
    secp256k1_ge_set_xy(&d_ge, &d.x, &d.y);
    secp256k1_ge_set_gej_zinv(&pre_a[0], a, &d.z);
    secp256k1_gej_set_ge(&ai, &pre_a[0]);
    ai.z = a->z;

    /* pre_a[0] is the point (a.x*C^2, a.y*C^3, a.z*C) which is equivalent to a.
     * Set zr[0] to C, which is the ratio between the omitted z(pre_a[0]) value and a.z.
     */
    zr[0] = d.z;

    for (i = 1; i < n; i++) {
        secp256k1_gej_add_ge_var(&ai, &ai, &d_ge, &zr[i]);
        secp256k1_ge_set_xy(&pre_a[i], &ai.x, &ai.y);
    }

    /* Multiply the last z-coordinate by C to undo the isomorphism.
     * Since the z-coordinates of the pre_a values are implied by the zr array of z-coordinate ratios,
     * undoing the isomorphism here undoes the isomorphism for all pre_a values.
     */
    secp256k1_fe_mul(z, &ai.z, &d.z);
}